

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTCreateEngine(uint32_t dwCreationFlags,FACTAudioEngine **ppEngine)

{
  uint32_t uVar1;
  
  uVar1 = FACTCreateEngineWithCustomAllocatorEXT
                    (dwCreationFlags,ppEngine,SDL_malloc,SDL_free,SDL_realloc);
  return uVar1;
}

Assistant:

uint32_t FACTCreateEngine(
	uint32_t dwCreationFlags,
	FACTAudioEngine **ppEngine
) {
	return FACTCreateEngineWithCustomAllocatorEXT(
		dwCreationFlags,
		ppEngine,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}